

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O2

ConfigKey * ConfigKey::merge_max_files(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfigKey *in_RDI;
  allocator<char> local_31;
  pointer local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"merge_max_files",&local_31);
  paVar1 = &(in_RDI->key_).field_2;
  (in_RDI->key_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_1f,local_20);
    *(undefined8 *)((long)&(in_RDI->key_).field_2 + 8) = uStack_18;
  }
  else {
    (in_RDI->key_)._M_dataplus._M_p = local_30;
    (in_RDI->key_).field_2._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
  }
  (in_RDI->key_)._M_string_length = local_28;
  local_28 = 0;
  local_20 = '\0';
  in_RDI->defval_ = 0x200000;
  in_RDI->min_ = 1;
  in_RDI->max_ = 0xffffffff;
  local_30 = &local_20;
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

const static ConfigKey merge_max_files() {
        return ConfigKey("merge_max_files", 2 * 1024 * 1024, 1, 4294967295);
    }